

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks,unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *visit_cache)

{
  bool bVar1;
  SmallVector<unsigned_int,_8UL> *pSVar2;
  uint *puVar3;
  size_type sVar4;
  uint *succ;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  _Node_iterator_base<unsigned_int,_false> local_38;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_30;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *visit_cache_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks_local;
  CFG *pCStack_18;
  uint32_t block_local;
  CFG *cfg_local;
  
  local_30 = visit_cache;
  visit_cache_local = blocks;
  blocks_local._4_4_ = block;
  pCStack_18 = cfg;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(blocks,(key_type *)((long)&blocks_local + 4));
  __range1 = (SmallVector<unsigned_int,_8UL> *)
             std::
             end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                       (visit_cache_local);
  bVar1 = std::__detail::operator!=(&local_38,(_Node_iterator_base<unsigned_int,_false> *)&__range1)
  ;
  if (bVar1) {
    cfg_local._7_1_ = false;
  }
  else {
    pSVar2 = spirv_cross::CFG::get_succeeding_edges(pCStack_18,blocks_local._4_4_);
    bVar1 = spirv_cross::VectorView<unsigned_int>::empty(&pSVar2->super_VectorView<unsigned_int>);
    if (bVar1) {
      cfg_local._7_1_ = true;
    }
    else {
      pSVar2 = spirv_cross::CFG::get_succeeding_edges(pCStack_18,blocks_local._4_4_);
      __end1 = spirv_cross::VectorView<unsigned_int>::begin(&pSVar2->super_VectorView<unsigned_int>)
      ;
      puVar3 = spirv_cross::VectorView<unsigned_int>::end(&pSVar2->super_VectorView<unsigned_int>);
      for (; __end1 != puVar3; __end1 = __end1 + 1) {
        sVar4 = std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count(local_30,__end1);
        if (sVar4 == 0) {
          bVar1 = exists_unaccessed_path_to_return(pCStack_18,*__end1,visit_cache_local,local_30);
          if (bVar1) {
            return true;
          }
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(local_30,__end1);
        }
      }
      cfg_local._7_1_ = false;
    }
  }
  return cfg_local._7_1_;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks,
                                             unordered_set<uint32_t> &visit_cache)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
	{
		if (visit_cache.count(succ) == 0)
		{
			if (exists_unaccessed_path_to_return(cfg, succ, blocks, visit_cache))
				return true;
			visit_cache.insert(succ);
		}
	}

	return false;
}